

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_filesystem.cpp
# Opt level: O0

int __thiscall Omega_h::filesystem::IteratorImpl::close(IteratorImpl *this,int __fd)

{
  int iVar1;
  int *piVar2;
  filesystem_error *this_00;
  int err;
  IteratorImpl *this_local;
  
  if (this->stream != (DIR *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    iVar1 = closedir((DIR *)this->stream);
    this->stream = (DIR *)0x0;
    if (iVar1 != 0) {
      this_00 = (filesystem_error *)__cxa_allocate_exception(0x20);
      piVar2 = __errno_location();
      filesystem_error::filesystem_error(this_00,*piVar2,"directory_iterator");
      __cxa_throw(this_00,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
    }
  }
  return (int)this;
}

Assistant:

void close() {
    if (stream == nullptr) return;
    errno = 0;
    int err = ::closedir(stream);
    stream = nullptr;
    if (err != 0) {
      throw filesystem_error(errno, "directory_iterator");
    }
  }